

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp4.c
# Opt level: O1

ReturnCode expand(Global *global,DEFBUF *tokenp)

{
  char *pcVar1;
  int iVar2;
  ReturnCode RVar3;
  FILEINFO *pFVar4;
  Global *pGVar5;
  char *pcVar6;
  int iVar7;
  
  iVar7 = global->recursion;
  iVar2 = iVar7 + 1;
  global->recursion = iVar2;
  if (iVar7 == 0) {
    global->macro = tokenp;
  }
  else if ((iVar2 == 1000) &&
          (cerror(global,ERROR_RECURSIVE_MACRO,tokenp->name,global->macro->name),
          global->rec_recover != 0)) {
    do {
      get(global);
      if (global->infile == (FILEINFO *)0x0) break;
    } while (global->infile->fp == (FILE *)0x0);
    unget(global);
    global->recursion = 0;
    return FPP_OK;
  }
  global->nargs = 0;
  global->parmp = global->parm;
  switch(tokenp->nargs) {
  case -5:
    sprintf(global->work,"%d",(ulong)(uint)global->funcline);
    goto LAB_0010490b;
  case -4:
    pcVar6 = "<unknown function>";
    if (*global->functionname != '\0') {
      pcVar6 = global->functionname;
    }
    break;
  case -3:
    pFVar4 = global->infile;
    while( true ) {
      if (pFVar4 == (FILEINFO *)0x0) {
        return FPP_OK;
      }
      if (pFVar4->fp != (FILE *)0x0) break;
      pFVar4 = pFVar4->parent;
    }
    pcVar6 = pFVar4->progname;
    if (pFVar4->progname == (char *)0x0) {
      pcVar6 = pFVar4->filename;
    }
    break;
  case -2:
    pFVar4 = global->infile;
    pGVar5 = global;
    if (pFVar4->fp == (FILE *)0x0) {
      for (; pFVar4 != (FILEINFO *)0x0; pFVar4 = pFVar4->parent) {
        if (pFVar4->fp != (FILE *)0x0) {
          pGVar5 = (Global *)&pFVar4->line;
          goto LAB_0010489d;
        }
      }
    }
    else {
LAB_0010489d:
      sprintf(global->work,"%d",(ulong)(uint)pGVar5->line);
    }
    RVar3 = ungetstring(global,global->work);
    if (RVar3 != FPP_OK) {
      return RVar3;
    }
    return FPP_OK;
  default:
    if (tokenp->nargs < 0) {
      cerror(global,FATAL_ILLEGAL_MACRO,tokenp->name);
      return FPP_ILLEGAL_MACRO;
    }
    while (iVar2 = skipws(global), iVar2 == 10) {
      global->wrongline = 1;
    }
    if (iVar2 != 0x28) {
      unget(global);
      cerror(global,WARN_MACRO_NEEDS_ARGUMENTS,tokenp->name);
      Putstring(global,tokenp->name);
      return FPP_OK;
    }
    pcVar6 = global->parm + 0x400;
    while( true ) {
      while (iVar2 = skipws(global), iVar2 == 10) {
        global->wrongline = 1;
      }
      if (iVar2 == 0x29) break;
      iVar7 = global->nargs;
      if (0x1e < (long)iVar7) {
        cerror(global,FATAL_TOO_MANY_ARGUMENTS_EXPANSION);
        RVar3 = FPP_TOO_MANY_ARGUMENTS;
        goto LAB_00104b61;
      }
      global->nargs = iVar7 + 1;
      global->parlist[iVar7] = global->parmp;
      iVar7 = 0;
LAB_001049be:
      if (iVar2 == 0x5c) {
        pcVar1 = global->parmp;
        if (pcVar1 < pcVar6) {
          global->parmp = pcVar1 + 1;
          *pcVar1 = '\\';
        }
        else {
          cerror(global,FATAL_MACRO_AREA_OVERFLOW);
        }
        iVar2 = cget(global);
LAB_00104a27:
        pcVar1 = global->parmp;
        if (pcVar1 < pcVar6) {
          global->parmp = pcVar1 + 1;
          *pcVar1 = (char)iVar2;
        }
        else {
          cerror(global,FATAL_MACRO_AREA_OVERFLOW);
        }
LAB_00104a51:
        iVar2 = cget(global);
        goto LAB_001049be;
      }
      if (iVar2 == 0) {
        cerror(global,ERROR_EOF_IN_ARGUMENT);
        RVar3 = FPP_EOF_IN_MACRO;
        goto LAB_00104b61;
      }
      if (type[iVar2] == 'A') {
        RVar3 = scanstring(global,iVar2,charput);
        if (RVar3 != FPP_OK) goto LAB_00104b61;
        goto LAB_00104a51;
      }
      if (iVar2 != 0x29) {
        if (iVar2 == 0x28) {
          iVar7 = iVar7 + 1;
        }
        else {
          if (iVar2 == 0x2c && iVar7 == 0) goto LAB_00104aa3;
          if (iVar2 == 10) {
            global->wrongline = 1;
          }
        }
        goto LAB_00104a27;
      }
      if (iVar7 != 0) {
        iVar7 = iVar7 + -1;
        goto LAB_00104a27;
      }
      unget(global);
LAB_00104aa3:
      pcVar1 = global->parmp;
      if (pcVar1 < pcVar6) {
        global->parmp = pcVar1 + 1;
        *pcVar1 = '\0';
      }
      else {
        cerror(global,FATAL_MACRO_AREA_OVERFLOW);
      }
    }
    *global->parmp = '\0';
    RVar3 = FPP_OK;
LAB_00104b61:
    if (RVar3 != FPP_OK) {
      return RVar3;
    }
    if (tokenp->nargs != global->nargs) {
      cerror(global,WARN_WRONG_NUMBER_ARGUMENTS,tokenp->name);
    }
  case -1:
    RVar3 = expstuff(global,tokenp->name,tokenp->repl);
    return RVar3;
  }
  sprintf(global->work,"\"%s\"",pcVar6);
LAB_0010490b:
  RVar3 = ungetstring(global,global->work);
  if (RVar3 != FPP_OK) {
    return RVar3;
  }
  return FPP_OK;
}

Assistant:

ReturnCode expand(struct Global *global, DEFBUF *tokenp)
{
  /*
   * Expand a macro.  Called from the cpp mainline routine (via subroutine
   * macroid()) when a token is found in the symbol table.  It calls
   * expcollect() to parse actual parameters, checking for the correct number.
   * It then creates a "file" containing a single line containing the
   * macro with actual parameters inserted appropriately.  This is
   * "pushed back" onto the input stream.  (When the get() routine runs
   * off the end of the macro line, it will dismiss the macro itself.)
   */
  int c;
  FILEINFO *file;
  ReturnCode ret=FPP_OK;
      
  /*
   * If no macro is pending, save the name of this macro
   * for an eventual error message.
   */
  if (global->recursion++ == 0)
    global->macro = tokenp;
  else if (global->recursion == RECURSION_LIMIT) {
    cerror(global, ERROR_RECURSIVE_MACRO, tokenp->name, global->macro->name);
    if (global->rec_recover) {
      do {
	c = get(global);
      } while (global->infile != NULL && global->infile->fp == NULL);
      unget(global);
      global->recursion = 0;
      return(FPP_OK);
    }
  }
  /*
   * Here's a macro to expand.
   */
  global->nargs = 0;			/* Formals counter	*/
  global->parmp = global->parm;		/* Setup parm buffer	*/
  switch (tokenp->nargs) {
  case (-2):                              /* __LINE__             */
      if(global->infile->fp)
	  /* This is a file */
	  sprintf(global->work, "%d", global->line);
      else
	  /* This is a macro! Find out the file line number! */
	  for (file = global->infile; file != NULL; file = file->parent) {
	      if (file->fp != NULL) {
		  sprintf(global->work, "%d", file->line);
		  break;
	      }
	  }
      ret=ungetstring(global, global->work);
      if(ret)
	  return(ret);
      break;
    
  case (-3):                              /* __FILE__             */
    for (file = global->infile; file != NULL; file = file->parent) {
      if (file->fp != NULL) {
	sprintf(global->work, "\"%s\"", (file->progname != NULL)
		? file->progname : file->filename);
	ret=ungetstring(global, global->work);
	if(ret)
	  return(ret);
	break;
      }
    }
    break;

  case (-4):				/* __FUNC__ */
    sprintf(global->work, "\"%s\"", global->functionname[0]?
	    global->functionname : "<unknown function>");
    ret=ungetstring(global, global->work);
    if(ret)
	return(ret);
    break;

  case (-5):                              /* __FUNC_LINE__ */
    sprintf(global->work, "%d", global->funcline);
    ret=ungetstring(global, global->work);
    if(ret)
      return(ret);
    break;

  default:
    /*
     * Nothing funny about this macro.
     */
    if (tokenp->nargs < 0) {
      cfatal(global, FATAL_ILLEGAL_MACRO, tokenp->name);
      return(FPP_ILLEGAL_MACRO);
    }
    while ((c = skipws(global)) == '\n')      /* Look for (, skipping */
      global->wrongline = TRUE;		/* spaces and newlines	*/
    if (c != '(') {
      /*
       * If the programmer writes
       *	#define foo() ...
       *	...
       *	foo [no ()]
       * just write foo to the output stream.
       */
      unget(global);
      cwarn(global, WARN_MACRO_NEEDS_ARGUMENTS, tokenp->name);

      /* fputs(tokenp->name, stdout); */
      Putstring(global, tokenp->name);
      return(FPP_OK);
    } else if (!(ret=expcollect(global))) {     /* Collect arguments    */
      if (tokenp->nargs != global->nargs) {     /* Should be an error?  */
	cwarn(global, WARN_WRONG_NUMBER_ARGUMENTS, tokenp->name);
      }
    } else {				/* Collect arguments		*/
      return(ret); /* We failed in argument colleting! */
    }
  case DEF_NOARGS:			/* No parameters just stuffs	*/
    ret=expstuff(global, tokenp->name, tokenp->repl); /* expand macro   */
  }					/* nargs switch 		*/
  return(ret);
}